

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeSIMDReplace<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,SIMDReplaceOp op,size_t lanes)

{
  bool bVar1;
  uchar *puVar2;
  allocator<char> local_81;
  string local_80;
  Err local_60;
  _Optional_payload_base<unsigned_char> local_3a;
  size_t sStack_38;
  optional<unsigned_char> lane;
  size_t lanes_local;
  SIMDReplaceOp op_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  sStack_38 = lanes;
  local_3a = (_Optional_payload_base<unsigned_char>)Lexer::takeU8(&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_3a);
  if (bVar1) {
    puVar2 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)&local_3a);
    NullInstrParserCtx::makeSIMDReplace
              (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations,op,*puVar2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"expected lane index",&local_81);
    Lexer::err(&local_60,&ctx->in,&local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_60);
    wasm::Err::~Err(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDReplace(Ctx& ctx,
                         Index pos,
                         const std::vector<Annotation>& annotations,
                         SIMDReplaceOp op,
                         size_t lanes) {
  auto lane = ctx.in.takeU8();
  if (!lane) {
    return ctx.in.err("expected lane index");
  }
  return ctx.makeSIMDReplace(pos, annotations, op, *lane);
}